

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O3

bool __thiscall String::maskAgainst(String *this,String *pattern)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  bool bVar6;
  String pattern_upper;
  String this_upper;
  String local_48;
  String local_28;
  
  toUppercase(&local_48,pattern);
  toUppercase(&local_28,this);
  cVar2 = *local_28._string._M_dataplus._M_p;
  bVar6 = true;
  _Var5._M_p = local_48._string._M_dataplus._M_p;
  _Var4._M_p = local_28._string._M_dataplus._M_p;
  do {
    if (cVar2 == '\0') {
LAB_0012f911:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._string._M_dataplus._M_p != &local_28._string.field_2) {
        operator_delete(local_28._string._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._string._M_dataplus._M_p != &local_48._string.field_2) {
        operator_delete(local_48._string._M_dataplus._M_p);
      }
      return bVar6;
    }
    cVar3 = *_Var5._M_p;
    if (cVar3 == '*') {
      pcVar1 = _Var5._M_p + 1;
      if (*pcVar1 == '\0') goto LAB_0012f911;
      _Var5._M_p = _Var5._M_p + 1;
      _Var4._M_p = _Var4._M_p + -1;
      do {
        cVar2 = _Var4._M_p[1];
        _Var4._M_p = _Var4._M_p + 1;
        if (cVar2 == *pcVar1) break;
      } while (cVar2 != '\0');
joined_r0x0012f8f5:
      if (cVar2 == '\0') {
LAB_0012f90f:
        bVar6 = false;
        goto LAB_0012f911;
      }
    }
    else {
      if (cVar3 == '?') {
        cVar2 = _Var4._M_p[1];
        goto joined_r0x0012f8f5;
      }
      if (cVar2 != cVar3) goto LAB_0012f90f;
    }
    _Var5._M_p = _Var5._M_p + 1;
    cVar2 = _Var4._M_p[1];
    _Var4._M_p = _Var4._M_p + 1;
  } while( true );
}

Assistant:

bool String::maskAgainst (const String& pattern) const
{
	// Elevate to uppercase for case-insensitive matching
	String pattern_upper = pattern.toUppercase();
	String this_upper = toUppercase();
	const char* maskstring = pattern_upper.c_str();
	const char* mptr = &maskstring[0];

	for (const char* sptr = this_upper.c_str(); *sptr != '\0'; sptr++)
	{
		if (*mptr == '?')
		{
			if (*(sptr + 1) == '\0')
			{
				// ? demands that there's a character here and there wasn't.
				// Therefore, mask matching fails
				return false;
			}
		}
		elif (*mptr == '*')
		{
			char end = *(++mptr);

			// If '*' is the final character of the message, all of the remaining
			// string matches against the '*'. We don't need to bother checking
			// the string any further.
			if (end == '\0')
				return true;

			// Skip to the end character
			while (*sptr != end and *sptr != '\0')
				sptr++;

			// String ended while the mask still had stuff
			if (*sptr == '\0')
				return false;
		}
		elif (*sptr != *mptr)
			return false;

		mptr++;
	}

	return true;
}